

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_yplus_metric
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs,
          REF_BOOL sample_viscous_length_error)

{
  int iVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL ref_cell;
  REF_DBL *pRVar4;
  REF_EDGE ref_edge;
  REF_GRID ref_grid_00;
  uint uVar5;
  REF_STATUS RVar6;
  REF_BOOL RVar7;
  REF_INT *vector;
  ulong uVar8;
  REF_DBL *vector_00;
  REF_DBL *pRVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  REF_INT bc;
  REF_DBL *local_1c8;
  REF_NODE local_1c0;
  REF_DBL *local_1b8;
  REF_DBL local_1b0;
  REF_GRID local_1a8;
  REF_DBL *local_1a0;
  REF_DBL local_198;
  REF_DBL local_190;
  REF_DBL edg_norm [3];
  double local_168;
  double local_160;
  undefined8 local_158;
  REF_DBL local_150;
  REF_DBL RStack_148;
  REF_DBL local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  REF_INT edg_nodes [27];
  REF_DBL logm [6];
  REF_DBL m [6];
  
  pRVar3 = ref_grid->node;
  uVar5 = pRVar3->max;
  uVar15 = (ulong)uVar5;
  if ((int)uVar5 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x40e,
           "ref_phys_yplus_metric","malloc hits of REF_INT negative");
    RVar6 = 1;
  }
  else {
    local_1b0 = re;
    local_1a8 = ref_grid;
    local_198 = target;
    local_190 = mach;
    vector = (REF_INT *)malloc(uVar15 * 4);
    if (vector == (REF_INT *)0x0) {
      pcVar14 = "malloc hits of REF_INT NULL";
      uVar12 = 0x40e;
    }
    else {
      for (uVar8 = 0; uVar8 < uVar15; uVar8 = uVar8 + 1) {
        vector[uVar8] = 0;
      }
      local_1c0 = pRVar3;
      local_1b8 = metric;
      vector_00 = (REF_DBL *)malloc(uVar15 * 0x30);
      if (vector_00 == (REF_DBL *)0x0) {
        pcVar14 = "malloc new_log_metric of REF_DBL NULL";
        uVar12 = 0x40f;
      }
      else {
        for (uVar8 = 0; (uVar15 * 6 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
          vector_00[uVar8] = 0.0;
        }
        pRVar9 = (REF_DBL *)malloc(uVar15 * 8);
        if (pRVar9 == (REF_DBL *)0x0) {
          pcVar14 = "malloc lengthscale of REF_DBL NULL";
          uVar12 = 0x410;
        }
        else {
          for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            pRVar9[uVar8] = 0.0;
          }
          local_1a0 = pRVar9;
          local_1c8 = (REF_DBL *)malloc(uVar15 * 8);
          ref_grid_00 = local_1a8;
          if (local_1c8 != (REF_DBL *)0x0) {
            for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
              local_1c8[uVar8] = 0.0;
            }
            uVar5 = ref_phys_yplus_lengthscale
                              (local_1a8,local_190,local_1b0,temperature,ldim,field,local_1a0);
            if (uVar5 == 0) {
              uVar5 = ref_phys_yplus_lengthscale2
                                (ref_grid_00,local_190,local_1b0,temperature,ldim,field,local_1c8);
              if (uVar5 == 0) {
                if (ref_grid_00->twod == 0) {
                  uVar5 = 6;
                  pcVar14 = "implement 3D";
                  uVar12 = 0x45a;
                }
                else {
                  ref_cell = ref_grid_00->cell[0];
                  for (iVar16 = 0; pRVar3 = local_1c0, iVar16 < ref_cell->max; iVar16 = iVar16 + 1)
                  {
                    RVar6 = ref_cell_nodes(ref_cell,iVar16,edg_nodes);
                    if (RVar6 == 0) {
                      bc = -1;
                      uVar5 = ref_dict_value(ref_dict_bcs,edg_nodes[ref_cell->node_per],&bc);
                      if ((uVar5 != 0) && (uVar5 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x426,"ref_phys_yplus_metric",(ulong)uVar5);
                        local_1b0 = (REF_DBL)CONCAT44(local_1b0._4_4_,uVar5);
                      }
                      if ((uVar5 != 5) && (uVar5 != 0)) {
                        return local_1b0._0_4_;
                      }
                      RVar7 = ref_phys_wall_distance_bc(bc);
                      if (RVar7 != 0) {
                        uVar5 = ref_layer_interior_seg_normal(local_1a8,iVar16,edg_norm);
                        pRVar9 = local_1b8;
                        if (uVar5 != 0) {
                          pcVar14 = "edge norm";
                          uVar12 = 0x428;
                          goto LAB_001c9957;
                        }
                        local_150 = edg_norm[0];
                        RStack_148 = edg_norm[1];
                        local_140 = edg_norm[2];
                        lVar10 = (long)edg_nodes[0];
                        dVar17 = (local_1b8[lVar10 * 6 + 5] * edg_norm[2] +
                                 local_1b8[lVar10 * 6 + 2] * edg_norm[0] +
                                 edg_norm[1] * local_1b8[lVar10 * 6 + 4]) * edg_norm[2] +
                                 (local_1b8[lVar10 * 6 + 2] * edg_norm[2] +
                                 local_1b8[lVar10 * 6] * edg_norm[0] +
                                 edg_norm[1] * local_1b8[lVar10 * 6 + 1]) * edg_norm[0] +
                                 (local_1b8[lVar10 * 6 + 4] * edg_norm[2] +
                                 local_1b8[lVar10 * 6 + 1] * edg_norm[0] +
                                 local_1b8[lVar10 * 6 + 3] * edg_norm[1]) * edg_norm[1];
                        if (dVar17 < 0.0) {
                          dVar17 = sqrt(dVar17);
                        }
                        else {
                          dVar17 = SQRT(dVar17);
                        }
                        lVar10 = (long)edg_nodes[1];
                        dVar18 = (pRVar9[lVar10 * 6 + 5] * edg_norm[2] +
                                 pRVar9[lVar10 * 6 + 2] * edg_norm[0] +
                                 edg_norm[1] * pRVar9[lVar10 * 6 + 4]) * edg_norm[2] +
                                 (pRVar9[lVar10 * 6 + 2] * edg_norm[2] +
                                 pRVar9[lVar10 * 6] * edg_norm[0] +
                                 pRVar9[lVar10 * 6 + 1] * edg_norm[1]) * edg_norm[0] +
                                 (pRVar9[lVar10 * 6 + 4] * edg_norm[2] +
                                 pRVar9[lVar10 * 6 + 1] * edg_norm[0] +
                                 pRVar9[lVar10 * 6 + 3] * edg_norm[1]) * edg_norm[1];
                        if (dVar18 < 0.0) {
                          dVar18 = sqrt(dVar18);
                        }
                        else {
                          dVar18 = SQRT(dVar18);
                        }
                        lVar11 = (long)edg_nodes[0];
                        lVar10 = (long)edg_nodes[1];
                        dVar19 = (local_1a0[lVar10] + local_1a0[lVar11]) * 0.5;
                        dVar20 = (local_1c8[lVar10] + local_1c8[lVar11]) * 0.5 - dVar19;
                        if (dVar20 <= -dVar20) {
                          dVar20 = -dVar20;
                        }
                        dVar20 = dVar20 / dVar19 + -0.1;
                        if (dVar20 <= 0.0) {
                          dVar20 = 0.0;
                        }
                        dVar20 = dVar20 / 0.1;
                        if (1.0 <= dVar20) {
                          dVar20 = 1.0;
                        }
                        dVar21 = (dVar19 * local_198) / 0.866025403784439;
                        if (sample_viscous_length_error != 0) {
                          dVar21 = dVar20 * (1.0 / ((dVar17 + dVar18) * 0.5)) +
                                   ((1.0 - dVar20) * local_198 * dVar19) / 0.866025403784439;
                        }
                        local_168 = 1.0 / (dVar21 * dVar21);
                        pRVar4 = local_1a8->node->real;
                        printf("x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n"
                               ,(pRVar4[lVar11 * 0xf] + pRVar4[lVar10 * 0xf]) * 0.5);
                        local_120 = 0;
                        uStack_118 = 0;
                        local_110 = 0x3ff0000000000000;
                        local_158 = 0x3ff0000000000000;
                        local_130 = local_150 - local_140 * 0.0;
                        local_138 = local_140 * 0.0 - RStack_148;
                        local_128 = RStack_148 * 0.0 + local_150 * -0.0;
                        lVar10 = (long)edg_nodes[0];
                        dVar17 = (pRVar9[lVar10 * 6 + 5] * local_128 +
                                 local_138 * pRVar9[lVar10 * 6 + 2] +
                                 local_130 * pRVar9[lVar10 * 6 + 4]) * local_128 +
                                 (pRVar9[lVar10 * 6 + 2] * local_128 +
                                 pRVar9[lVar10 * 6] * local_138 + local_130 * pRVar9[lVar10 * 6 + 1]
                                 ) * local_138 +
                                 (pRVar9[lVar10 * 6 + 4] * local_128 +
                                 pRVar9[lVar10 * 6 + 1] * local_138 +
                                 pRVar9[lVar10 * 6 + 3] * local_130) * local_130;
                        if (dVar17 < 0.0) {
                          dVar17 = sqrt(dVar17);
                        }
                        else {
                          dVar17 = SQRT(dVar17);
                        }
                        lVar10 = (long)edg_nodes[1];
                        dVar18 = (pRVar9[lVar10 * 6 + 5] * local_128 +
                                 pRVar9[lVar10 * 6 + 2] * local_138 +
                                 local_130 * pRVar9[lVar10 * 6 + 4]) * local_128 +
                                 (pRVar9[lVar10 * 6 + 2] * local_128 +
                                 pRVar9[lVar10 * 6] * local_138 + pRVar9[lVar10 * 6 + 1] * local_130
                                 ) * local_138 +
                                 (pRVar9[lVar10 * 6 + 4] * local_128 +
                                 pRVar9[lVar10 * 6 + 1] * local_138 +
                                 pRVar9[lVar10 * 6 + 3] * local_130) * local_130;
                        if (dVar18 < 0.0) {
                          dVar18 = sqrt(dVar18);
                        }
                        else {
                          dVar18 = SQRT(dVar18);
                        }
                        dVar17 = 1.0 / ((dVar17 + dVar18) * 0.5);
                        local_160 = 1.0 / (dVar17 * dVar17);
                        uVar5 = ref_matrix_form_m(&local_168,m);
                        if (uVar5 != 0) {
                          pcVar14 = "form";
                          uVar12 = 0x44e;
                          goto LAB_001c9957;
                        }
                        uVar5 = ref_matrix_log_m(m,logm);
                        if (uVar5 != 0) {
                          pcVar14 = "form";
                          uVar12 = 0x44f;
                          goto LAB_001c9957;
                        }
                        for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                          vector_00[edg_nodes[0] * 6 + lVar10] =
                               logm[lVar10] + vector_00[edg_nodes[0] * 6 + lVar10];
                        }
                        vector[edg_nodes[0]] = vector[edg_nodes[0]] + 1;
                        for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
                          vector_00[edg_nodes[1] * 6 + lVar10] =
                               logm[lVar10] + vector_00[edg_nodes[1] * 6 + lVar10];
                        }
                        vector[edg_nodes[1]] = vector[edg_nodes[1]] + 1;
                      }
                    }
                  }
                  uVar5 = ref_node_ghost_dbl(local_1c0,vector_00,6);
                  if (uVar5 == 0) {
                    uVar5 = ref_node_ghost_int(pRVar3,vector,1);
                    if (uVar5 == 0) {
                      pRVar9 = vector_00;
                      for (lVar10 = 0; lVar10 < local_1c0->max; lVar10 = lVar10 + 1) {
                        if ((-1 < local_1c0->global[lVar10]) &&
                           (iVar16 = vector[lVar10], 0 < iVar16)) {
                          for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
                            pRVar9[lVar11] = pRVar9[lVar11] / (double)iVar16;
                          }
                          vector[lVar10] = -1;
                          uVar5 = ref_matrix_exp_m(vector_00 + lVar10 * 6,local_1b8 + lVar10 * 6);
                          if (uVar5 != 0) {
                            pcVar14 = "form";
                            uVar12 = 0x467;
                            goto LAB_001c9957;
                          }
                        }
                        pRVar9 = pRVar9 + 6;
                      }
                      uVar5 = ref_edge_create((REF_EDGE *)edg_nodes,local_1a8);
                      if (uVar5 == 0) {
                        ref_edge = (REF_EDGE)CONCAT44(edg_nodes[1],edg_nodes[0]);
                        for (lVar10 = 0; lVar10 < ref_edge->n; lVar10 = lVar10 + 1) {
                          iVar16 = ref_edge->e2n[lVar10 * 2];
                          iVar1 = ref_edge->e2n[lVar10 * 2 + 1];
                          iVar13 = vector[iVar16];
                          if ((-1 < iVar13) && (vector[iVar1] == -1)) {
                            for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
                              vector_00[iVar16 * 6 + lVar11] =
                                   vector_00[iVar1 * 6 + lVar11] + vector_00[iVar16 * 6 + lVar11];
                            }
                            iVar13 = iVar13 + 1;
                            vector[iVar16] = iVar13;
                          }
                          iVar2 = vector[iVar1];
                          if ((-1 < iVar2) && (iVar13 == -1)) {
                            for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
                              vector_00[iVar1 * 6 + lVar11] =
                                   vector_00[iVar16 * 6 + lVar11] + vector_00[iVar1 * 6 + lVar11];
                            }
                            vector[iVar1] = iVar2 + 1;
                          }
                        }
                        ref_edge_free(ref_edge);
                        pRVar3 = local_1c0;
                        uVar5 = ref_node_ghost_dbl(local_1c0,vector_00,6);
                        if (uVar5 == 0) {
                          uVar5 = ref_node_ghost_int(pRVar3,vector,1);
                          if (uVar5 == 0) {
                            pRVar9 = vector_00;
                            for (lVar10 = 0; lVar10 < local_1c0->max; lVar10 = lVar10 + 1) {
                              if ((-1 < local_1c0->global[lVar10]) &&
                                 (iVar16 = vector[lVar10], 0 < iVar16)) {
                                for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 1) {
                                  pRVar9[lVar11] = pRVar9[lVar11] / (double)iVar16;
                                }
                                vector[lVar10] = -2;
                                uVar5 = ref_matrix_exp_m(vector_00 + lVar10 * 6,
                                                         local_1b8 + lVar10 * 6);
                                if (uVar5 != 0) {
                                  pcVar14 = "form";
                                  uVar12 = 0x48c;
                                  goto LAB_001c9957;
                                }
                              }
                              pRVar9 = pRVar9 + 6;
                            }
                            uVar5 = ref_node_ghost_dbl(local_1c0,local_1b8,6);
                            if (uVar5 == 0) {
                              free(local_1c8);
                              free(local_1a0);
                              free(vector_00);
                              free(vector);
                              return 0;
                            }
                            pcVar14 = "ghost metric";
                            uVar12 = 0x490;
                          }
                          else {
                            pcVar14 = "ghost hits";
                            uVar12 = 0x483;
                          }
                        }
                        else {
                          pcVar14 = "ghost metric";
                          uVar12 = 0x482;
                        }
                      }
                      else {
                        pcVar14 = "orig edges";
                        uVar12 = 0x46e;
                      }
                    }
                    else {
                      pcVar14 = "ghost hits";
                      uVar12 = 0x45e;
                    }
                  }
                  else {
                    pcVar14 = "ghost metric";
                    uVar12 = 0x45d;
                  }
                }
              }
              else {
                pcVar14 = "length scale";
                uVar12 = 0x417;
              }
            }
            else {
              pcVar14 = "length scale";
              uVar12 = 0x414;
            }
LAB_001c9957:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   uVar12,"ref_phys_yplus_metric",(ulong)uVar5,pcVar14);
            return uVar5;
          }
          pcVar14 = "malloc lengthscale2 of REF_DBL NULL";
          uVar12 = 0x411;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar12,
           "ref_phys_yplus_metric",pcVar14);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric(REF_GRID ref_grid, REF_DBL *metric,
                                         REF_DBL mach, REF_DBL re,
                                         REF_DBL temperature, REF_DBL target,
                                         REF_INT ldim, REF_DBL *field,
                                         REF_DICT ref_dict_bcs,
                                         REF_BOOL sample_viscous_length_error) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *lengthscale2, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale2, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  RSS(ref_phys_yplus_lengthscale2(ref_grid, mach, re, temperature, ldim, field,
                                  lengthscale2),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], mh, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    REF_DBL err1 = 0.10, err2 = 0.20;
    REF_DBL l1, l2, s1, s2, diff;
    REF_DBL equilateral_altitude =
        0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;
      l1 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);
      l2 = 0.5 * (lengthscale2[edg_nodes[0]] + lengthscale2[edg_nodes[1]]);
      diff = ABS(l2 - l1) / l1;
      s2 = MIN(MAX(diff - err1, 0.0) / (err2 - err1), 1.0);
      s1 = 1.0 - s2;
      h0 = (s1 * target * l1 / equilateral_altitude + s2 * mh);
      if (!sample_viscous_length_error) {
        h0 = target * l1 / equilateral_altitude;
      }
      ref_matrix_eig(d, 0) = 1.0 / (h0 * h0);

      printf(
          "x %.4f l1 %.3e l2 %.3e diff %.4f s %.2f %.2f t %.3e m %.3e h %.3e\n",
          0.5 * (ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[0]) +
                 ref_node_xyz(ref_grid_node(ref_grid), 0, edg_nodes[1])),
          l1, l2, diff, s1, s2, target * l1 / equilateral_altitude, mh, h0);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale2);
  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}